

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::checkVirtualIfaceInstance(Compilation *this,InstanceSymbol *instance)

{
  SourceRange range;
  SourceLocation location;
  bool bVar1;
  SourceLocation this_00;
  raw_key_type *__y;
  pointer pIVar2;
  reference ppHVar3;
  reference ppSVar4;
  InstanceSymbol *in_RSI;
  SourceLocation in_RDI;
  Symbol *port;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range2;
  Diagnostic *portDiag;
  Diagnostic *diag;
  vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  *upwardNames;
  iterator it;
  InstanceBodySymbol *body;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  InstanceBodySymbol *in_stack_fffffffffffffe28;
  Diagnostic *in_stack_fffffffffffffe30;
  SourceLocation in_stack_fffffffffffffe38;
  SourceLocation SVar5;
  SourceLocation SVar6;
  undefined8 in_stack_fffffffffffffe60;
  DiagCode noteCode;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_170;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_168;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_158;
  Diagnostic *local_150;
  SourceLocation local_148;
  SourceLocation local_140;
  undefined4 local_134;
  SourceLocation in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  InstanceBodySymbol *in_stack_fffffffffffffee0;
  InstanceBodySymbol *local_100;
  char_pointer local_f8;
  table_element_pointer local_f0;
  InstanceBodySymbol *local_e8;
  InstanceSymbol *local_e0;
  SourceLocation local_d0;
  SourceLocation local_c8;
  char_pointer local_c0;
  table_element_pointer local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  local_b0;
  SourceLocation local_98;
  SourceLocation local_90;
  iterator local_88;
  size_t local_78;
  SourceLocation local_70;
  SourceLocation local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SourceLocation local_10;
  SourceLocation local_8;
  
  local_e0 = in_RSI;
  local_e8 = InstanceSymbol::getCanonicalBody(in_RSI);
  if (local_e8 == (InstanceBodySymbol *)0x0) {
    local_e8 = local_e0->body;
  }
  this_00 = (SourceLocation)((long)in_RDI + 0x370);
  local_100 = local_e8;
  local_d0 = (SourceLocation)&local_100;
  local_c8 = this_00;
  local_98 = local_d0;
  local_90 = this_00;
  local_70 = local_d0;
  local_68 = this_00;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
             ::hash_for<slang::ast::Symbol_const*>
                       ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
                         *)in_stack_fffffffffffffe30,(Symbol **)in_stack_fffffffffffffe28);
  SVar5 = local_70;
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
                             *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
  local_20 = local_78;
  SVar6 = this_00;
  local_10 = SVar5;
  local_8 = this_00;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
               ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
                         *)0x5844a2);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
                 ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
                             *)0x5844ed);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffe30 =
             (Diagnostic *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
                     *)0x58453d);
        in_stack_fffffffffffffe38 = local_10;
        __y = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
              ::
              key_from<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>
                        ((pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>
                          *)0x58456a);
        bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                          ((equal_to<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffe30,
                           (Symbol **)in_stack_fffffffffffffe38,__y);
        noteCode = SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>
          ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
          goto LAB_0058465e;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    noteCode = SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0);
    if (bVar1) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,*(size_t *)((long)SVar6 + 8));
    noteCode = SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0);
    if (!bVar1) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>
      ::table_locator(&local_b0);
LAB_0058465e:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
                 ::make_iterator((locator *)0x58466b);
      local_c0 = local_88.pc_;
      local_b8 = local_88.p_;
      local_f8 = local_88.pc_;
      local_f0 = local_88.p_;
      boost::unordered::
      unordered_flat_map<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
      ::end((unordered_flat_map<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
             *)0x5846cc);
      bVar1 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffe30,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffe28);
      if (bVar1) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffe30);
        pIVar2 = std::
                 unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                 ::operator->((unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                               *)0x584713);
        bVar1 = std::
                vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                ::empty((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                         *)this_00);
        if (!bVar1) {
          in_stack_fffffffffffffedc = 0x21000d;
          in_stack_fffffffffffffed0 = (local_e0->super_InstanceSymbolBase).super_Symbol.location;
          location._4_4_ = 0x21000d;
          location._0_4_ = in_stack_fffffffffffffed8;
          in_stack_fffffffffffffe28 =
               (InstanceBodySymbol *)
               Scope::addDiag((Scope *)in_stack_fffffffffffffed0,
                              SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0),location);
          local_134 = 0x28000d;
          in_stack_fffffffffffffee0 = in_stack_fffffffffffffe28;
          ppHVar3 = std::
                    vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
                    ::operator[](&pIVar2->upwardNames,0);
          local_148 = ((*ppHVar3)->expr->sourceRange).startLoc;
          local_140 = ((*ppHVar3)->expr->sourceRange).endLoc;
          range.endLoc = in_RDI;
          range.startLoc = SVar6;
          Diagnostic::addNote((Diagnostic *)SVar5,noteCode,range);
        }
      }
      local_150 = (Diagnostic *)0x0;
      local_168 = InstanceBodySymbol::getPortList(in_stack_fffffffffffffe28);
      local_158 = &local_168;
      local_170._M_current =
           (Symbol **)
           std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffffe28);
      std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                 in_stack_fffffffffffffe38);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffe30,
                                (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                                 *)in_stack_fffffffffffffe28), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppSVar4 = __gnu_cxx::
                  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                  ::operator*(&local_170);
        if ((*ppSVar4)->kind == InterfacePort) {
          if (local_150 == (Diagnostic *)0x0) {
            SVar5._4_4_ = in_stack_fffffffffffffedc;
            SVar5._0_4_ = in_stack_fffffffffffffed8;
            local_150 = Scope::addDiag((Scope *)in_stack_fffffffffffffed0,
                                       SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0),SVar5);
          }
          Diagnostic::addNote(in_stack_fffffffffffffe30,this_00._4_4_,in_stack_fffffffffffffe38);
        }
        __gnu_cxx::
        __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
        ::operator++(&local_170);
      }
      return;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  ::table_locator(&local_b0);
  goto LAB_0058465e;
}

Assistant:

void Compilation::checkVirtualIfaceInstance(const InstanceSymbol& instance) {
    auto body = instance.getCanonicalBody();
    if (!body)
        body = &instance.body;

    if (auto it = instanceSideEffectMap.find(body); it != instanceSideEffectMap.end()) {
        auto& upwardNames = it->second->upwardNames;
        if (!upwardNames.empty()) {
            auto& diag = body->addDiag(diag::VirtualIfaceHierRef, instance.location);
            diag.addNote(diag::NoteHierarchicalRef, upwardNames[0]->expr->sourceRange);
        }
    }

    Diagnostic* portDiag = nullptr;
    for (auto port : body->getPortList()) {
        if (port->kind == SymbolKind::InterfacePort) {
            if (!portDiag)
                portDiag = &body->addDiag(diag::VirtualIfaceIfacePort, instance.location);
            portDiag->addNote(diag::NoteDeclarationHere, port->location);
        }
    }
}